

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O3

void __thiscall
MinVR::VRDatumFloatArray::VRDatumFloatArray(VRDatumFloatArray *this,VRFloatArray *inVal)

{
  vector<float,_std::allocator<float>_> local_28;
  
  std::vector<float,_std::allocator<float>_>::vector(&local_28,inVal);
  VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>::
  VRDatumSpecialized((VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>
                      *)this,&local_28);
  if (local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (this->
  super_VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>).
  super_VRDatum_conflict._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_00129ac0;
  return;
}

Assistant:

VRDatumFloatArray(const VRFloatArray inVal) :
    VRDatumSpecialized<VRFloatArray, VRCORETYPE_FLOATARRAY>(inVal) {}